

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Literal * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::wrapToSmallerSize
          (Literal *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,Literal *value
          ,Index bytes)

{
  uintptr_t uVar1;
  anon_union_16_6_1532cd5a_for_Literal_0 local_28;
  undefined8 local_18;
  
  uVar1 = (value->type).id;
  if (uVar1 == 3) {
    switch(bytes) {
    case 1:
      local_28.i64 = 0xff;
      local_18 = 3;
      Literal::and_(__return_storage_ptr__,value,(Literal *)&local_28.func);
      break;
    case 2:
      local_28.i64 = 0xffff;
      local_18 = 3;
      Literal::and_(__return_storage_ptr__,value,(Literal *)&local_28.func);
      break;
    default:
      handle_unreachable("unexpected bytes",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                         ,0x1184);
    case 4:
      local_28.i64 = 0xffffffff;
      local_18 = 3;
      Literal::and_(__return_storage_ptr__,value,(Literal *)&local_28.func);
      break;
    case 8:
      goto switchD_00d278a1_caseD_8;
    }
  }
  else {
    if (uVar1 != 2) {
      __assert_fail("value.type == Type::i64",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                    ,0x1175,
                    "Literal wasm::ModuleRunnerBase<wasm::ModuleRunner>::wrapToSmallerSize(Literal, Index) [SubType = wasm::ModuleRunner]"
                   );
    }
    if (bytes == 4) {
switchD_00d278a1_caseD_8:
      Literal::Literal(__return_storage_ptr__,value);
      return __return_storage_ptr__;
    }
    if (bytes == 2) {
      local_28.i32 = 0xffff;
      local_18 = 2;
      Literal::and_(__return_storage_ptr__,value,(Literal *)&local_28.func);
    }
    else {
      if (bytes != 1) {
        handle_unreachable("unexpected bytes",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                           ,0x1172);
      }
      local_28.i32 = 0xff;
      local_18 = 2;
      Literal::and_(__return_storage_ptr__,value,(Literal *)&local_28.func);
    }
  }
  Literal::~Literal((Literal *)&local_28.func);
  return __return_storage_ptr__;
}

Assistant:

Literal wrapToSmallerSize(Literal value, Index bytes) {
    if (value.type == Type::i32) {
      switch (bytes) {
        case 1: {
          return value.and_(Literal(uint32_t(0xff)));
        }
        case 2: {
          return value.and_(Literal(uint32_t(0xffff)));
        }
        case 4: {
          break;
        }
        default:
          WASM_UNREACHABLE("unexpected bytes");
      }
    } else {
      assert(value.type == Type::i64);
      switch (bytes) {
        case 1: {
          return value.and_(Literal(uint64_t(0xff)));
        }
        case 2: {
          return value.and_(Literal(uint64_t(0xffff)));
        }
        case 4: {
          return value.and_(Literal(uint64_t(0xffffffffUL)));
        }
        case 8: {
          break;
        }
        default:
          WASM_UNREACHABLE("unexpected bytes");
      }
    }
    return value;
  }